

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void __thiscall
Encoder::SaveToLazyBailOutRecordList(Encoder *this,Instr *instr,uint32 currentOffset)

{
  Type *pTVar1;
  int iVar2;
  BailOutRecord *pBVar3;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pLVar4;
  code *pcVar5;
  bool bVar6;
  uint sourceContextId;
  uint functionId;
  BailOutInfo *pBVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  
  pBVar7 = IR::Instr::GetBailOutInfo(instr);
  bVar6 = IR::Instr::OnlyHasLazyBailOut(instr);
  if ((!bVar6) || (pBVar7->bailOutRecord == (BailOutRecord *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x67d,
                       "(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr)",
                       "instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,LazyBailoutPhase,sourceContextId,functionId)
  ;
  if (bVar6) {
    Output::Print(L"Offset: %u Instr: ");
    IR::Instr::Dump(instr);
    Output::Print(L"Bailout label: ");
    IR::Instr::Dump(pBVar7->bailOutInstr);
  }
  pBVar3 = pBVar7->bailOutRecord;
  this_00 = this->m_sortedLazyBailoutRecordList;
  JsUtil::
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(this_00,0);
  pLVar4 = (this_00->super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>)
           .buffer;
  iVar2 = (this_00->super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).
          count;
  pLVar4[iVar2].offset = currentOffset;
  pLVar4[iVar2].bailOutRecord = pBVar3;
  pTVar1 = &(this_00->super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void
Encoder::SaveToLazyBailOutRecordList(IR::Instr* instr, uint32 currentOffset)
{
    BailOutInfo* bailOutInfo = instr->GetBailOutInfo();

    Assert(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr);

#if DBG_DUMP
    if (PHASE_DUMP(Js::LazyBailoutPhase, m_func))
    {
        Output::Print(_u("Offset: %u Instr: "), currentOffset);
        instr->Dump();
        Output::Print(_u("Bailout label: "));
        bailOutInfo->bailOutInstr->Dump();
    }
#endif

    LazyBailOutRecord record(currentOffset, bailOutInfo->bailOutRecord);
    this->m_sortedLazyBailoutRecordList->Add(record);
}